

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAnalytic_mels.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  N_Vector y;
  N_Vector yp;
  long lVar4;
  long *plVar5;
  char *pcVar6;
  double dVar7;
  sunrealtype rtol;
  sunrealtype atol;
  SUNContext ctx;
  sunrealtype t;
  long nreLS;
  long ncfn;
  long netf;
  long nni;
  long nre;
  long nst;
  sunrealtype alpha;
  undefined8 local_88;
  double local_80;
  double local_78;
  long local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  undefined8 local_48;
  long local_40 [2];
  
  local_40[1] = 0x4024000000000000;
  puts("\nAnalytical DAE test problem:");
  printf("    alpha = %g\n",0x4024000000000000);
  printf("   reltol = %.1e\n",0x3f1a36e2eb1c432d);
  printf("   abstol = %.1e\n\n",0x3e112e0be826d695);
  uVar2 = SUNContext_Create(0,&local_88);
  if ((int)uVar2 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(2,local_88);
    if (y == (N_Vector)0x0) {
      main_cold_4();
      return 1;
    }
    yp = (N_Vector)N_VClone(y);
    if (yp == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    analytical_solution(0.0,y,yp);
    lVar4 = IDACreate(local_88);
    local_40[0] = lVar4;
    if (lVar4 == 0) {
      main_cold_2();
      return 1;
    }
    uVar2 = IDAInit(0,lVar4,fres,y,yp);
    if ((int)uVar2 < 0) {
      pcVar6 = "IDAInit";
    }
    else {
      uVar2 = IDASetUserData(lVar4,local_40 + 1);
      if ((int)uVar2 < 0) {
        pcVar6 = "IDASetUserData";
      }
      else {
        uVar2 = IDASStolerances(0x3f1a36e2eb1c432d,0x3e112e0be826d695,lVar4);
        if ((int)uVar2 < 0) {
          pcVar6 = "IDASStolerances";
        }
        else {
          plVar5 = (long *)SUNLinSolNewEmpty(local_88);
          if (plVar5 == (long *)0x0) {
            main_cold_1();
            return 1;
          }
          puVar1 = (undefined8 *)plVar5[1];
          *puVar1 = MatrixEmbeddedLSType;
          puVar1[8] = MatrixEmbeddedLSSolve;
          puVar1[0xe] = MatrixEmbeddedLSFree;
          *plVar5 = lVar4;
          uVar2 = IDASetLinearSolver(lVar4,plVar5,0);
          if ((int)uVar2 < 0) {
            pcVar6 = "IDASetLinearSolver";
          }
          else {
            local_80 = 0.0;
            puts("        t          x1         x2");
            puts("   ----------------------------------");
            dVar7 = 0.1;
            while (local_78 = dVar7, uVar2 = IDASolve(lVar4,&local_80,y,yp,1), -1 < (int)uVar2) {
              puVar1 = *(undefined8 **)((long)y->content + 0x10);
              printf("  %10.6f  %10.6f  %10.6f\n",local_80,*puVar1,puVar1[1]);
              atol = local_78 + 0.1;
              rtol = 1.0 - local_80;
              dVar7 = 1.0;
              if (atol <= 1.0) {
                dVar7 = atol;
              }
              if (rtol <= 1e-15) {
                puts("   ----------------------------------");
                uVar2 = IDAGetNumSteps(lVar4,&local_48);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "IDAGetNumSteps",(ulong)uVar2);
                }
                uVar2 = IDAGetNumResEvals(lVar4,&local_50);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "IDAGetNumResEvals",(ulong)uVar2);
                }
                uVar2 = IDAGetNumNonlinSolvIters(lVar4,&local_58);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "IDAGetNumNonlinSolvIters",(ulong)uVar2);
                }
                uVar2 = IDAGetNumErrTestFails(lVar4,&local_60);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "IDAGetNumErrTestFails",(ulong)uVar2);
                }
                uVar2 = IDAGetNumNonlinSolvConvFails(lVar4,&local_68);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "IDAGetNumNonlinSolvConvFails",(ulong)uVar2);
                }
                uVar2 = IDAGetNumLinResEvals(lVar4,&local_70);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "IDAGetNumLinResEvals",(ulong)uVar2);
                }
                puts("\nFinal Solver Statistics: \n");
                printf("Number of steps                    = %ld\n",local_48);
                printf("Number of residual evaluations     = %ld\n",local_70 + local_50);
                printf("Number of nonlinear iterations     = %ld\n",local_58);
                printf("Number of error test failures      = %ld\n",local_60);
                printf("Number of nonlinear conv. failures = %ld\n",local_68);
                iVar3 = check_ans(y,local_80,rtol,atol);
                IDAFree(local_40);
                SUNLinSolFree(plVar5);
                N_VDestroy(y);
                N_VDestroy(yp);
                SUNContext_Free(&local_88);
                return iVar3;
              }
            }
            pcVar6 = "IDASolve";
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar6,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  /* SUNDIALS context object */
  SUNContext ctx;

  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype dTout  = SUN_RCONST(0.1);    /* time between outputs */
  sunindextype NEQ   = 2;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-4); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-9);
  sunrealtype alpha  = SUN_RCONST(10.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector yy        = NULL; /* empty vector for storing solution */
  N_Vector yp        = NULL; /* empty vector for storing solution derivative */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* ida_mem      = NULL; /* empty IDA memory structure */
  sunrealtype t, tout;
  long int nst, nre, nni, netf, ncfn, nreLS;

  /* Initial diagnostics output */
  printf("\nAnalytical DAE test problem:\n");
  printf("    alpha = %" GSYM "\n", alpha);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Initialize data structures */
  yy = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return 1; }
  yp = N_VClone(yy); /* Create serial vector for solution derivative */
  if (check_retval((void*)yp, "N_VClone", 0)) { return 1; }
  analytical_solution(T0, yy, yp); /* Specify initial conditions */

  /* Call IDACreate and IDAInit to initialize IDA memory */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }
  retval = IDAInit(ida_mem, fres, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set routines */
  retval = IDASetUserData(ida_mem, (void*)&alpha);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }
  retval = IDASStolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(ida_mem, ctx);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }

  /* Attach the linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* In loop, call IDASolve, print results, and test for error.
     Stops when the final time has been reached. */
  t    = T0;
  tout = T0 + dTout;
  printf("        t          x1         x2\n");
  printf("   ----------------------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = IDASolve(ida_mem, tout, &t, yy, yp, IDA_NORMAL); /* call integrator */
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(yy, 0), NV_Ith_S(yy, 1)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ----------------------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = IDAGetNumSteps(ida_mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumResEvals(ida_mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetNumNonlinSolvIters(ida_mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumErrTestFails(ida_mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(ida_mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  retval = IDAGetNumLinResEvals(ida_mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);

  printf("\nFinal Solver Statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", ncfn);

  /* check the solution error */
  retval = check_ans(yy, t, reltol, abstol);

  /* Clean up and return */
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  N_VDestroy(yy);
  N_VDestroy(yp);
  SUNContext_Free(&ctx);

  return (retval);
}